

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall ImplicitDepLoader::LoadDepsFromLog(ImplicitDepLoader *this,Edge *edge,string *err)

{
  Node *pNVar1;
  Node *pNVar2;
  FILE *pFVar3;
  reference ppNVar4;
  undefined8 uVar5;
  TimeStamp TVar6;
  reference ppNVar7;
  Deps *local_60;
  Node *node;
  iterator iStack_40;
  int i;
  iterator implicit_dep;
  Deps *deps;
  Node *output;
  string *err_local;
  Edge *edge_local;
  ImplicitDepLoader *this_local;
  
  ppNVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&edge->outputs_,0);
  pNVar1 = *ppNVar4;
  if (this->deps_log_ == (DepsLog *)0x0) {
    local_60 = (Deps *)0x0;
  }
  else {
    local_60 = DepsLog::GetDeps(this->deps_log_,pNVar1);
  }
  pFVar3 = _stderr;
  implicit_dep._M_current = (Node **)local_60;
  if (local_60 == (Deps *)0x0) {
    if ((g_explaining & 1U) != 0) {
      Node::path_abi_cxx11_(pNVar1);
      uVar5 = std::__cxx11::string::c_str();
      fprintf(pFVar3,"ninja explain: deps for \'%s\' are missing\n",uVar5);
    }
    this_local._7_1_ = false;
  }
  else {
    TVar6 = Node::mtime(pNVar1);
    pFVar3 = _stderr;
    if ((long)*implicit_dep._M_current < TVar6) {
      if ((g_explaining & 1U) != 0) {
        Node::path_abi_cxx11_(pNVar1);
        uVar5 = std::__cxx11::string::c_str();
        pNVar2 = *implicit_dep._M_current;
        TVar6 = Node::mtime(pNVar1);
        fprintf(pFVar3,"ninja explain: stored deps info out of date for \'%s\' (%ld vs %ld)\n",uVar5
                ,pNVar2,TVar6);
      }
      this_local._7_1_ = false;
    }
    else {
      iStack_40 = PreallocateSpace(this,edge,*(int *)(implicit_dep._M_current + 1));
      node._4_4_ = 0;
      while (node._4_4_ < *(int *)(implicit_dep._M_current + 1)) {
        pNVar1 = *(Node **)(&(implicit_dep._M_current[2]->path_)._M_dataplus + (long)node._4_4_ * 8)
        ;
        ppNVar7 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&stack0xffffffffffffffc0);
        *ppNVar7 = pNVar1;
        Node::AddOutEdge(pNVar1,edge);
        CreatePhonyInEdge(this,pNVar1);
        node._4_4_ = node._4_4_ + 1;
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&stack0xffffffffffffffc0);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ImplicitDepLoader::LoadDepsFromLog(Edge* edge, string* err) {
  // NOTE: deps are only supported for single-target edges.
  Node* output = edge->outputs_[0];
  DepsLog::Deps* deps = deps_log_ ? deps_log_->GetDeps(output) : NULL;
  if (!deps) {
    EXPLAIN("deps for '%s' are missing", output->path().c_str());
    return false;
  }

  // Deps are invalid if the output is newer than the deps.
  if (output->mtime() > deps->mtime) {
    EXPLAIN("stored deps info out of date for '%s' (%" PRId64 " vs %" PRId64 ")",
            output->path().c_str(), deps->mtime, output->mtime());
    return false;
  }

  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, deps->node_count);
  for (int i = 0; i < deps->node_count; ++i, ++implicit_dep) {
    Node* node = deps->nodes[i];
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }
  return true;
}